

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

string * __thiscall cppcms::archive::read_chunk_as_string_abi_cxx11_(archive *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_RSI;
  string *in_RDI;
  size_t size;
  string *result;
  allocator local_1a;
  undefined1 local_19;
  ulong local_18;
  
  local_18 = next_chunk_size((archive *)result);
  local_19 = 0;
  lVar3 = std::__cxx11::string::c_str();
  uVar2 = local_18;
  lVar1 = *(long *)(in_RSI + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)(lVar3 + 4 + lVar1),uVar2,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  *(ulong *)(in_RSI + 0x20) = local_18 + 4 + *(long *)(in_RSI + 0x20);
  return in_RDI;
}

Assistant:

std::string archive::read_chunk_as_string()
{
	size_t size = next_chunk_size();
	std::string result(buffer_.c_str() + ptr_ + 4,size);
	ptr_ +=4+size;
	return result;
}